

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp
# Opt level: O3

IterateResult __thiscall
glcts::NonColorDepthStencilRenderableInternalformatsAreRejectedTest::iterate
          (NonColorDepthStencilRenderableInternalformatsAreRejectedTest *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  TestError *this_00;
  char *description;
  qpTestResult testResult;
  TestContext *this_01;
  long lVar4;
  
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,
                     "GL_OES_texture_storage_multisample_2d_array");
  this->gl_oes_texture_multisample_2d_array_supported = bVar1;
  if (bVar1) {
    iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    initInternals(this);
    if (this->to_id == 0) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Texture object has not been generated.","to_id != 0",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp"
                 ,0x1d4);
LAB_00c068aa:
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    lVar4 = 0;
    do {
      (**(code **)(CONCAT44(extraout_var,iVar2) + 0x13a8))
                (0x9102,1,*(undefined4 *)((long)&unsupported_internalformats + lVar4),1,1,1,1);
      iVar3 = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
      if (iVar3 != 0x500) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"gltexStorage3DMultisample() did not generate GL_INVALID_ENUM error.",
                   "gl.getError() == GL_INVALID_ENUM",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp"
                   ,0x1e4);
        goto LAB_00c068aa;
      }
      lVar4 = lVar4 + 4;
    } while (lVar4 != 0xc);
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Pass";
    testResult = QP_TEST_RESULT_PASS;
  }
  else {
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "OES_texture_storage_multisample_2d_array";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_01,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult NonColorDepthStencilRenderableInternalformatsAreRejectedTest::iterate()
{
	gl_oes_texture_multisample_2d_array_supported =
		m_context.getContextInfo().isExtensionSupported("GL_OES_texture_storage_multisample_2d_array");

	if (!gl_oes_texture_multisample_2d_array_supported)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "OES_texture_storage_multisample_2d_array");

		return STOP;
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	initInternals();

	/* Check if texture object was generated properly. */
	TCU_CHECK_MSG(to_id != 0, "Texture object has not been generated.");

	const int number_of_internalformats_to_check =
		sizeof(unsupported_internalformats) / sizeof(unsupported_internalformats[0]);

	/* Go through all requested internalformats. */
	for (int internalformat_index = 0; internalformat_index < number_of_internalformats_to_check;
		 internalformat_index++)
	{
		gl.texStorage3DMultisample(
			GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, 1,
			unsupported_internalformats[internalformat_index], /* One of unsupported internalformats. */
			1, 1, 1, true);

		/* Expect GL_INVALID_ENUM error code. */
		TCU_CHECK_MSG(gl.getError() == GL_INVALID_ENUM,
					  "gltexStorage3DMultisample() did not generate GL_INVALID_ENUM error.");
	} /* for each unsupported internalformat */

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}